

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void different_stl_string_references_are_not_equal(void)

{
  Constraint_ *pCVar1;
  string alice;
  string bob;
  allocator local_59;
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"bob",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"alice",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pCVar1 = (Constraint_ *)cgreen::create_not_equal_to_string_constraint(local_58,"alice");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x76,"bob",local_20,pCVar1);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

Ensure(different_stl_string_references_are_not_equal) {
    std::string bob("bob");
    std::string alice("alice");
    assert_that(bob, is_not_equal_to_string(alice));
}